

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

int motion_field_projection(AV1_COMMON *cm,MV_REFERENCE_FRAME start_frame,int dir)

{
  short sVar1;
  int iVar2;
  TPL_MV_REF *pTVar3;
  SequenceHeader *pSVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  MV_REFERENCE_FRAME *pMVar20;
  RefCntBuffer *pRVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  int local_78;
  int local_74;
  uint local_58 [10];
  int base_blk_row;
  int ref_offset [8];
  
  pTVar3 = cm->tpl_mvs;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  iVar13 = -1;
  if ((byte)(start_frame - 1U) < 8) {
    iVar13 = cm->remapped_ref_idx[(byte)start_frame - 1];
  }
  if (iVar13 == -1) {
    pRVar21 = (RefCntBuffer *)0x0;
  }
  else {
    pRVar21 = cm->ref_frame_map[iVar13];
  }
  iVar13 = 0;
  if ((((pRVar21 != (RefCntBuffer *)0x0) && (iVar13 = 0, (pRVar21->frame_type & 0xfd) != 0)) &&
      (iVar15 = (cm->mi_params).mi_rows, iVar13 = 0, pRVar21->mi_rows == iVar15)) &&
     (iVar2 = (cm->mi_params).mi_cols, pRVar21->mi_cols == iVar2)) {
    uVar18 = pRVar21->order_hint;
    pSVar4 = cm->seq_params;
    iVar13 = (pSVar4->order_hint_info).enable_order_hint;
    if (iVar13 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = uVar18 - cm->cur_frame->order_hint;
      uVar22 = 1 << ((byte)(pSVar4->order_hint_info).order_hint_bits_minus_1 & 0x1f);
      uVar12 = (uVar22 - 1 & uVar12) - (uVar22 & uVar12);
    }
    lVar16 = 0;
    do {
      uVar22 = 0;
      if (iVar13 != 0) {
        uVar22 = uVar18 - pRVar21->ref_order_hints[lVar16];
        uVar23 = 1 << ((byte)(pSVar4->order_hint_info).order_hint_bits_minus_1 & 0x1f);
        uVar22 = (uVar23 - 1 & uVar22) - (uVar23 & uVar22);
      }
      local_58[lVar16 + 1] = uVar22;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 7);
    uVar18 = iVar15 + 1 >> 1;
    iVar13 = 1;
    if (0 < (int)uVar18) {
      uVar23 = iVar2 + 1 >> 1;
      uVar22 = uVar12;
      if ((int)uVar12 < 1) {
        uVar22 = -uVar12;
      }
      uVar19 = -uVar12;
      if (dir != 2) {
        uVar19 = uVar12;
      }
      uVar12 = 0xffffffe1;
      if (-0x1f < (int)uVar19) {
        uVar12 = uVar19;
      }
      uVar7 = 0x1f;
      if ((int)uVar19 < 0x1f) {
        uVar7 = uVar19;
      }
      if ((int)uVar19 < 1) {
        uVar7 = uVar12;
      }
      pMVar20 = &pRVar21->mvs->ref_frame;
      uVar25 = 0;
      do {
        if (0 < (int)uVar23) {
          uVar12 = (uint)uVar25 & 0x7ffffff8;
          uVar24 = 0;
          do {
            if (0 < (long)pMVar20[uVar24 * 8]) {
              uVar19 = local_58[pMVar20[uVar24 * 8]];
              uVar14 = -uVar19;
              if (0 < (int)uVar19) {
                uVar14 = uVar19;
              }
              sVar1 = *(short *)(pMVar20 + uVar24 * 8 + -2);
              bVar8 = (0 < (int)uVar19 && uVar22 < 0x20) && uVar14 < 0x20;
              if ((0 < (int)uVar19 && uVar22 < 0x20) && uVar14 < 0x20) {
                uVar11 = 0x1f;
                if ((int)uVar19 < 0x1f) {
                  uVar11 = (ulong)uVar19;
                }
                iVar13 = (int)*(short *)(pMVar20 + uVar24 * 8 + -4) * div_mult[uVar11] * uVar7;
                if (iVar13 < 0) {
                  uVar14 = -(0x2000U - iVar13 >> 0xe);
                }
                else {
                  uVar14 = iVar13 + 0x2000U >> 0xe;
                }
                iVar13 = div_mult[uVar11] * uVar7 * (int)sVar1;
                if (iVar13 < 0) {
                  uVar9 = -(0x2000U - iVar13 >> 0xe);
                }
                else {
                  uVar9 = iVar13 + 0x2000U >> 0xe;
                }
                uVar10 = uVar14;
                if (0x3ffe < (int)uVar14) {
                  uVar10 = 0x3fff;
                }
                if ((int)uVar10 < -0x3ffe) {
                  uVar10 = 0xffffc001;
                }
                uVar17 = uVar9;
                if (0x3ffe < (int)uVar9) {
                  uVar17 = 0x3fff;
                }
                if ((int)uVar17 < -0x3ffe) {
                  uVar17 = 0xffffc001;
                }
                uVar5 = -(-uVar10 >> 6);
                if (-1 < (int)uVar14) {
                  uVar5 = uVar10 >> 6;
                }
                uVar14 = -(-uVar17 >> 6);
                if (-1 < (int)uVar9) {
                  uVar14 = uVar17 >> 6;
                }
                uVar9 = -uVar14;
                uVar10 = -uVar5;
                if ((dir & 0xfffffffeU) != 2) {
                  uVar9 = uVar14;
                  uVar10 = uVar5;
                }
                bVar8 = false;
                bVar6 = false;
                iVar13 = uVar10 + (uint)uVar25;
                if ((-1 < iVar13) && (iVar13 < (cm->mi_params).mi_rows >> 1)) {
                  iVar15 = uVar9 + (uint)uVar24;
                  if ((((-1 < iVar15) &&
                       ((iVar15 < (cm->mi_params).mi_cols >> 1 &&
                        (bVar8 = bVar6, (int)uVar12 <= iVar13)))) && (iVar13 < (int)(uVar12 + 8)))
                     && ((uVar14 = (uint)uVar24 & 0x7ffffff8, (int)(uVar14 - 8) <= iVar15 &&
                         (iVar15 < (int)(uVar14 + 0x10))))) {
                    bVar8 = true;
                    local_78 = iVar15;
                    local_74 = iVar13;
                  }
                }
              }
              if (bVar8) {
                iVar13 = ((cm->mi_params).mi_stride >> 1) * local_74 + local_78;
                pTVar3[iVar13].mfmv0.as_mv.row = *(short *)(pMVar20 + uVar24 * 8 + -4);
                pTVar3[iVar13].mfmv0.as_mv.col = sVar1;
                pTVar3[iVar13].ref_frame_offset = (uint8_t)uVar19;
              }
            }
            uVar24 = uVar24 + 1;
          } while (uVar23 != uVar24);
        }
        uVar25 = uVar25 + 1;
        pMVar20 = pMVar20 + (ulong)uVar23 * 8;
      } while (uVar25 != uVar18);
      iVar13 = 1;
    }
  }
  return iVar13;
}

Assistant:

static int motion_field_projection(AV1_COMMON *cm,
                                   MV_REFERENCE_FRAME start_frame, int dir) {
  TPL_MV_REF *tpl_mvs_base = cm->tpl_mvs;
  int ref_offset[REF_FRAMES] = { 0 };

  const RefCntBuffer *const start_frame_buf =
      get_ref_frame_buf(cm, start_frame);
  if (start_frame_buf == NULL) return 0;

  if (start_frame_buf->frame_type == KEY_FRAME ||
      start_frame_buf->frame_type == INTRA_ONLY_FRAME)
    return 0;

  if (start_frame_buf->mi_rows != cm->mi_params.mi_rows ||
      start_frame_buf->mi_cols != cm->mi_params.mi_cols)
    return 0;

  const int start_frame_order_hint = start_frame_buf->order_hint;
  const unsigned int *const ref_order_hints =
      &start_frame_buf->ref_order_hints[0];
  const int cur_order_hint = cm->cur_frame->order_hint;
  int start_to_current_frame_offset = get_relative_dist(
      &cm->seq_params->order_hint_info, start_frame_order_hint, cur_order_hint);

  for (MV_REFERENCE_FRAME rf = LAST_FRAME; rf <= INTER_REFS_PER_FRAME; ++rf) {
    ref_offset[rf] = get_relative_dist(&cm->seq_params->order_hint_info,
                                       start_frame_order_hint,
                                       ref_order_hints[rf - LAST_FRAME]);
  }

  if (dir == 2) start_to_current_frame_offset = -start_to_current_frame_offset;

  MV_REF *mv_ref_base = start_frame_buf->mvs;
  const int mvs_rows = (cm->mi_params.mi_rows + 1) >> 1;
  const int mvs_cols = (cm->mi_params.mi_cols + 1) >> 1;

  for (int blk_row = 0; blk_row < mvs_rows; ++blk_row) {
    for (int blk_col = 0; blk_col < mvs_cols; ++blk_col) {
      MV_REF *mv_ref = &mv_ref_base[blk_row * mvs_cols + blk_col];
      MV fwd_mv = mv_ref->mv.as_mv;

      if (mv_ref->ref_frame > INTRA_FRAME) {
        int_mv this_mv;
        int mi_r, mi_c;
        const int ref_frame_offset = ref_offset[mv_ref->ref_frame];

        int pos_valid =
            abs(ref_frame_offset) <= MAX_FRAME_DISTANCE &&
            ref_frame_offset > 0 &&
            abs(start_to_current_frame_offset) <= MAX_FRAME_DISTANCE;

        if (pos_valid) {
          get_mv_projection(&this_mv.as_mv, fwd_mv,
                            start_to_current_frame_offset, ref_frame_offset);
          pos_valid = get_block_position(cm, &mi_r, &mi_c, blk_row, blk_col,
                                         this_mv.as_mv, dir >> 1);
        }

        if (pos_valid) {
          const int mi_offset = mi_r * (cm->mi_params.mi_stride >> 1) + mi_c;

          tpl_mvs_base[mi_offset].mfmv0.as_mv.row = fwd_mv.row;
          tpl_mvs_base[mi_offset].mfmv0.as_mv.col = fwd_mv.col;
          tpl_mvs_base[mi_offset].ref_frame_offset = ref_frame_offset;
        }
      }
    }
  }

  return 1;
}